

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaExporter::WriteFloatArray
          (ColladaExporter *this,string *pIdString,FloatDataType pType,ai_real *pData,
          size_t pElementCount)

{
  undefined1 *puVar1;
  string *psVar2;
  FloatDataType FVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  float *pfVar7;
  string arrayId;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  FloatDataType local_84;
  string local_80;
  long local_60;
  ulong local_58;
  string local_50;
  
  if (pType < (FloatType_Time|FloatType_TexCoord2)) {
    local_58 = (ulong)pType;
    local_60 = *(long *)(&DAT_006c8ca0 + local_58 * 8);
    XMLIDEncode(&local_80,pIdString);
    local_a8 = local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_80._M_dataplus._M_p,
               local_80._M_dataplus._M_p + local_80._M_string_length);
    std::__cxx11::string::append((char *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    puVar1 = &this->field_0x38;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<source id=\"",0xc);
    XMLIDEncode(&local_80,pIdString);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_80._M_dataplus._M_p,local_80._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" name=\"",8);
    XMLEscape(&local_50,pIdString);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\">",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    psVar2 = &this->startstr;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)psVar2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<float_array id=\"",0x11);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_a8,local_a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" count=\"",9);
    lVar6 = local_60 * pElementCount;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"> ",3);
    std::__cxx11::string::append((char *)psVar2);
    local_84 = pType;
    if (pType == FloatType_TexCoord2) {
      if (pElementCount != 0) {
        pfVar7 = pData + 1;
        do {
          poVar4 = std::ostream::_M_insert<double>((double)pfVar7[-1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = std::ostream::_M_insert<double>((double)*pfVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          pfVar7 = pfVar7 + 3;
          pElementCount = pElementCount - 1;
        } while (pElementCount != 0);
      }
    }
    else if (pType == FloatType_Color) {
      if (pElementCount != 0) {
        pfVar7 = pData + 2;
        do {
          poVar4 = std::ostream::_M_insert<double>((double)pfVar7[-2]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = std::ostream::_M_insert<double>((double)pfVar7[-1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = std::ostream::_M_insert<double>((double)*pfVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          pfVar7 = pfVar7 + 4;
          pElementCount = pElementCount - 1;
        } while (pElementCount != 0);
      }
    }
    else if (lVar6 != 0) {
      lVar5 = 0;
      do {
        poVar4 = std::ostream::_M_insert<double>((double)pData[lVar5]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        lVar5 = lVar5 + 1;
      } while (lVar6 - lVar5 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"</float_array>",0xe);
    FVar3 = local_84;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)puVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    PopTag(this);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<technique_common>",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    std::__cxx11::string::append((char *)psVar2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<accessor count=\"",0x11);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" offset=\"0\" source=\"#",0x16);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_a8,local_a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" stride=\"",10);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\">",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    std::__cxx11::string::append((char *)psVar2);
    if (FVar3 < (FloatType_Time|FloatType_TexCoord2)) {
      (*(code *)(&DAT_006c8c48 + *(int *)(&DAT_006c8c48 + local_58 * 4)))();
      return;
    }
    PopTag(this);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</accessor>",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    PopTag(this);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</technique_common>",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    PopTag(this);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</source>",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    if (local_a8 != local_98) {
      operator_delete(local_a8,local_98[0] + 1);
    }
  }
  return;
}

Assistant:

void ColladaExporter::WriteFloatArray( const std::string& pIdString, FloatDataType pType, const ai_real* pData, size_t pElementCount)
{
    size_t floatsPerElement = 0;
    switch( pType )
    {
        case FloatType_Vector: floatsPerElement = 3; break;
        case FloatType_TexCoord2: floatsPerElement = 2; break;
        case FloatType_TexCoord3: floatsPerElement = 3; break;
        case FloatType_Color: floatsPerElement = 3; break;
        case FloatType_Mat4x4: floatsPerElement = 16; break;
        case FloatType_Weight: floatsPerElement = 1; break;
		case FloatType_Time: floatsPerElement = 1; break;
        default:
            return;
    }

    std::string arrayId = XMLIDEncode(pIdString) + "-array";

    mOutput << startstr << "<source id=\"" << XMLIDEncode(pIdString) << "\" name=\"" << XMLEscape(pIdString) << "\">" << endstr;
    PushTag();

    // source array
    mOutput << startstr << "<float_array id=\"" << arrayId << "\" count=\"" << pElementCount * floatsPerElement << "\"> ";
    PushTag();

    if( pType == FloatType_TexCoord2 )
    {
        for( size_t a = 0; a < pElementCount; ++a )
        {
            mOutput << pData[a*3+0] << " ";
            mOutput << pData[a*3+1] << " ";
        }
    }
    else if( pType == FloatType_Color )
    {
        for( size_t a = 0; a < pElementCount; ++a )
        {
            mOutput << pData[a*4+0] << " ";
            mOutput << pData[a*4+1] << " ";
            mOutput << pData[a*4+2] << " ";
        }
    }
    else
    {
        for( size_t a = 0; a < pElementCount * floatsPerElement; ++a )
            mOutput << pData[a] << " ";
    }
    mOutput << "</float_array>" << endstr;
    PopTag();

    // the usual Collada fun. Let's bloat it even more!
    mOutput << startstr << "<technique_common>" << endstr;
    PushTag();
    mOutput << startstr << "<accessor count=\"" << pElementCount << "\" offset=\"0\" source=\"#" << arrayId << "\" stride=\"" << floatsPerElement << "\">" << endstr;
    PushTag();

    switch( pType )
    {
        case FloatType_Vector:
            mOutput << startstr << "<param name=\"X\" type=\"float\" />" << endstr;
            mOutput << startstr << "<param name=\"Y\" type=\"float\" />" << endstr;
            mOutput << startstr << "<param name=\"Z\" type=\"float\" />" << endstr;
            break;

        case FloatType_TexCoord2:
            mOutput << startstr << "<param name=\"S\" type=\"float\" />" << endstr;
            mOutput << startstr << "<param name=\"T\" type=\"float\" />" << endstr;
            break;

        case FloatType_TexCoord3:
            mOutput << startstr << "<param name=\"S\" type=\"float\" />" << endstr;
            mOutput << startstr << "<param name=\"T\" type=\"float\" />" << endstr;
            mOutput << startstr << "<param name=\"P\" type=\"float\" />" << endstr;
            break;

        case FloatType_Color:
            mOutput << startstr << "<param name=\"R\" type=\"float\" />" << endstr;
            mOutput << startstr << "<param name=\"G\" type=\"float\" />" << endstr;
            mOutput << startstr << "<param name=\"B\" type=\"float\" />" << endstr;
            break;

        case FloatType_Mat4x4:
            mOutput << startstr << "<param name=\"TRANSFORM\" type=\"float4x4\" />" << endstr;
            break;

        case FloatType_Weight:
            mOutput << startstr << "<param name=\"WEIGHT\" type=\"float\" />" << endstr;
            break;

		// customized, add animation related
		case FloatType_Time:
			mOutput << startstr << "<param name=\"TIME\" type=\"float\" />" << endstr;
			break;

	}

    PopTag();
    mOutput << startstr << "</accessor>" << endstr;
    PopTag();
    mOutput << startstr << "</technique_common>" << endstr;
    PopTag();
    mOutput << startstr << "</source>" << endstr;
}